

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

bool __thiscall rlist::listInsertNode(rlist *this,void *node,unsigned_long pos)

{
  listNode *plVar1;
  uint uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  listNode *plVar5;
  
  this->length = 0;
  plVar1 = this->rl->head;
  if (plVar1 != (listNode *)0x0) {
    uVar3 = 0;
    plVar5 = plVar1;
    do {
      uVar3 = uVar3 + 1;
      plVar5 = plVar5->next;
    } while (plVar5 != (listNode *)0x0);
    this->view = (listNode *)0x0;
    this->length = uVar3;
  }
  uVar4 = this->length;
  this->rl->len = uVar4;
  if (pos < uVar4) {
    this->view = plVar1;
    if (pos != 1) {
      uVar2 = 2;
      do {
        plVar1 = plVar1->next;
        uVar4 = (ulong)uVar2;
        uVar2 = uVar2 + 1;
      } while (uVar4 != pos);
      this->view = plVar1;
    }
    plVar1 = this->view;
    *(listNode **)((long)node + 8) = plVar1->next;
    *(listNode **)node = plVar1;
    plVar1->next->prev = (listNode *)node;
    plVar1->next = (listNode *)node;
  }
  else {
    if (uVar4 != pos) {
      return false;
    }
    listAppend(this,node);
  }
  return true;
}

Assistant:

bool rlist::listInsertNode(void *node,unsigned long pos){
    unsigned long tmp=rlist::listLength();
    if(tmp>pos){
        view=rl->head;
        for(unsigned int i=1;i!=pos;i++)
            view=view->next;
        ((listNode *)node)->next=view->next;
        ((listNode *)node)->prev=view;
        view->next->prev=(listNode *)node;
        view->next=(listNode *)node; 
        return true;
    }else if(tmp==pos)
        return rlist::listAppend(node);
    else 
        return false;
}